

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O2

void __thiscall
UnitDefinitions_SIextended_Test::~UnitDefinitions_SIextended_Test
          (UnitDefinitions_SIextended_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnitDefinitions, SIextended)
{
    using namespace units;

    unit s_2 = s * s;
    unit m_2 = m * m;

    // TODO(PT) check more of the possibilities
    // https://en.wikipedia.org/wiki/SI_derived_unit#Derived_units_with_special_names
    EXPECT_TRUE((one / s).has_same_base(Hz));
    EXPECT_TRUE((kg * m / s_2).has_same_base(N));
    EXPECT_TRUE((N / m_2).has_same_base(Pa));
    EXPECT_TRUE((N * m).has_same_base(J));
    EXPECT_TRUE((J / s).has_same_base(W));
    EXPECT_TRUE((s * A).has_same_base(C));
    EXPECT_TRUE((W / A).has_same_base(V));
    EXPECT_TRUE((C / V).has_same_base(F));
    EXPECT_TRUE((one / S).has_same_base(ohm));
    EXPECT_TRUE((one / ohm).has_same_base(S));
    EXPECT_TRUE((ohm.inv()).has_same_base(S));
    EXPECT_TRUE((J / A).has_same_base(Wb));
    EXPECT_TRUE((V * s / m_2).has_same_base(T));
    EXPECT_TRUE((V * s / A).has_same_base(H));
    EXPECT_TRUE((degC).has_same_base(K));
    EXPECT_TRUE((lm).equivalent_non_counting(cd));
    EXPECT_TRUE((lm / m_2).has_same_base(lx));
    EXPECT_TRUE((count / s).has_same_base(Bq));
    EXPECT_TRUE((J / kg).has_same_base(Gy));
    EXPECT_TRUE((J / kg).has_same_base(Sv));
    EXPECT_TRUE((mol / s).has_same_base(kat));
    EXPECT_TRUE((V / m).has_same_base(mV / yd));
}